

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

difference_type
QtPrivate::
sequential_erase_if<QList<QAbstractButton*>,QAbstractButtonPrivate::queryButtonList()const::__0>
          (QList<QAbstractButton_*> *c,anon_class_1_0_00000001_for__M_pred *pred)

{
  bool bVar1;
  QList<QAbstractButton_*> *this;
  QList<QAbstractButton_*> *pQVar2;
  difference_type dVar3;
  iterator *this_00;
  QAbstractButton **ppQVar4;
  QAbstractButton **in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  difference_type result;
  iterator dest;
  iterator it;
  iterator e;
  const_iterator t_it;
  const_iterator cend;
  const_iterator cbegin;
  QAbstractButton *in_stack_ffffffffffffff08;
  iterator in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff28;
  const_iterator in_stack_ffffffffffffff68;
  const_iterator local_88;
  QAbstractButton **local_80;
  const_iterator local_78;
  QAbstractButton **local_70;
  QAbstractButton **local_68;
  QAbstractButton **local_60;
  iterator local_58;
  iterator local_50;
  iterator local_48;
  QAbstractButton **local_40;
  QAbstractButton **local_38;
  QAbstractButton **local_30;
  QAbstractButton **local_28;
  QAbstractButton **local_20;
  QAbstractButton **local_18;
  QAbstractButton **local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QAbstractButton **)QList<QAbstractButton_*>::cbegin(in_stack_ffffffffffffff10.i);
  local_18 = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = (QAbstractButton **)QList<QAbstractButton_*>::cend(in_stack_ffffffffffffff10.i);
  local_20 = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = local_10;
  local_18 = local_30;
  local_40 = (QAbstractButton **)
             std::
             find_if<QList<QAbstractButton*>::const_iterator,QAbstractButtonPrivate::queryButtonList()const::__0>
                       (local_10,local_30);
  local_38 = local_10;
  local_20 = local_40;
  this = (QList<QAbstractButton_*> *)
         std::distance<QList<QAbstractButton*>::const_iterator>
                   ((const_iterator)in_stack_ffffffffffffff28.i,
                    (const_iterator)in_stack_ffffffffffffff20.i);
  pQVar2 = (QList<QAbstractButton_*> *)
           QList<QAbstractButton_*>::size((QList<QAbstractButton_*> *)in_RDI.i);
  if (this == pQVar2) {
    dVar3 = 0;
  }
  else {
    local_48.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = QList<QAbstractButton_*>::end(in_stack_ffffffffffffff10.i);
    local_50.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    QList<QAbstractButton_*>::begin((QList<QAbstractButton_*> *)in_stack_ffffffffffffff10.i);
    local_58 = std::next<QList<QAbstractButton*>::iterator>
                         (in_stack_ffffffffffffff10,(difference_type)in_stack_ffffffffffffff08);
    local_50 = local_58;
    while( true ) {
      this_00 = QList<QAbstractButton_*>::iterator::operator++(&local_50);
      local_60 = local_48.i;
      bVar1 = QList<QAbstractButton_*>::iterator::operator!=(this_00,local_48);
      if (!bVar1) break;
      in_stack_ffffffffffffff28.i = in_RSI;
      QList<QAbstractButton_*>::iterator::operator*(&local_50);
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractbutton.cpp:164:49)>
              ::anon_class_1_0_00000001_for__M_pred::operator()
                        ((anon_class_1_0_00000001_for__M_pred *)in_stack_ffffffffffffff10.i,
                         in_stack_ffffffffffffff08);
      if (!bVar1) {
        ppQVar4 = QList<QAbstractButton_*>::iterator::operator*(&local_50);
        in_stack_ffffffffffffff20.i = (QAbstractButton **)*ppQVar4;
        ppQVar4 = QList<QAbstractButton_*>::iterator::operator*(&local_58);
        *ppQVar4 = (QAbstractButton *)in_stack_ffffffffffffff20.i;
        QList<QAbstractButton_*>::iterator::operator++(&local_58);
      }
    }
    local_68 = local_58.i;
    local_70 = local_48.i;
    dVar3 = std::distance<QList<QAbstractButton*>::iterator>
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    local_80 = local_58.i;
    QList<QAbstractButton_*>::const_iterator::const_iterator(&local_78,local_58);
    QList<QAbstractButton_*>::const_iterator::const_iterator(&local_88,local_48);
    QList<QAbstractButton_*>::erase(this,in_stack_ffffffffffffff68,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return dVar3;
}

Assistant:

auto sequential_erase_if(Container &c, Predicate &pred)
{
    // This is remove_if() modified to perform the find_if step on
    // const_iterators to avoid shared container detaches if nothing needs to
    // be removed. We cannot run remove_if after find_if: doing so would apply
    // the predicate to the first matching element twice!

    const auto cbegin = c.cbegin();
    const auto cend = c.cend();
    const auto t_it = std::find_if(cbegin, cend, pred);
    auto result = std::distance(cbegin, t_it);
    if (result == c.size())
        return result - result; // `0` of the right type

    // now detach:
    const auto e = c.end();

    auto it = std::next(c.begin(), result);
    auto dest = it;

    // Loop Invariants:
    // - it != e
    // - [next(it), e[ still to be checked
    // - [c.begin(), dest[ are result
    while (++it != e) {
        if (!pred(*it)) {
            *dest = std::move(*it);
            ++dest;
        }
    }

    result = std::distance(dest, e);
    c.erase(dest, e);
    return result;
}